

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UniqueKmerIndex.cc
# Opt level: O3

void __thiscall
Unique63merIndex::Unique63merIndex(Unique63merIndex *this,SequenceDistanceGraph *sg,uint8_t _k)

{
  uint32_t uVar1;
  pointer puVar2;
  ulong uVar3;
  sgNodeID_t sVar4;
  value_type_conflict2 vVar5;
  uint uVar6;
  Support *pSVar7;
  pointer ppVar8;
  graphStrandPos *pgVar9;
  pointer pNVar10;
  mapped_type *pmVar11;
  pointer puVar12;
  graphStrandPos *pgVar13;
  pointer ppVar14;
  pointer ppVar15;
  pointer pNVar16;
  long lVar17;
  Unique63merIndex *this_00;
  long lVar18;
  ulong uVar19;
  pointer ppVar20;
  ulong uVar21;
  ulong uVar22;
  graphStrandPos *pgVar23;
  __normal_iterator<std::pair<unsigned___int128,_graphStrandPos>_*,_std::vector<std::pair<unsigned___int128,_graphStrandPos>,_std::allocator<std::pair<unsigned___int128,_graphStrandPos>_>_>_>
  __i;
  pointer ppVar24;
  pair<unsigned___int128,_graphStrandPos> *kidx;
  size_type __n;
  undefined1 auVar25 [16];
  double dVar26;
  undefined1 auVar27 [16];
  __hashtable *__this;
  vector<std::pair<unsigned___int128,_graphStrandPos>,_std::allocator<std::pair<unsigned___int128,_graphStrandPos>_>_>
  kidxv;
  FastaRecord r;
  unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_> seen_contigs;
  kmerPosFactory128 kcf;
  allocator_type local_3b1;
  Unique63merIndex *local_3b0;
  vector<std::pair<unsigned___int128,_graphStrandPos>,_std::allocator<std::pair<unsigned___int128,_graphStrandPos>_>_>
  local_3a8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_388;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_370;
  value_type_conflict2 local_368;
  value_type_conflict2 local_360;
  undefined1 *local_358;
  undefined8 local_350;
  undefined1 local_348;
  undefined7 uStack_347;
  undefined1 *local_338;
  undefined8 local_330;
  undefined1 local_328;
  undefined7 uStack_327;
  _Hashtable<long,_long,_std::allocator<long>,_std::__detail::_Identity,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_318;
  undefined1 local_2d8 [16];
  pointer local_2c8;
  undefined8 uStack_2c0;
  undefined8 local_2b8;
  undefined8 uStack_2b0;
  ulong local_2a8;
  ulong local_2a0;
  long local_298;
  long local_290;
  undefined1 local_288 [65];
  char local_247;
  char local_245;
  char local_241;
  char local_234;
  char local_227;
  char local_225;
  char local_221;
  char local_214;
  char local_198 [81];
  char local_147;
  char local_145;
  char local_141;
  char local_134;
  char local_127;
  char local_125;
  char local_121;
  char local_114;
  char local_98 [16];
  int32_t local_88;
  _Alloc_hider local_80;
  size_type local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_70;
  _Alloc_hider local_60;
  size_type local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_50 [2];
  
  (this->kmer_to_graphposition)._M_h._M_buckets =
       &(this->kmer_to_graphposition)._M_h._M_single_bucket;
  (this->kmer_to_graphposition)._M_h._M_bucket_count = 1;
  (this->kmer_to_graphposition)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->kmer_to_graphposition)._M_h._M_element_count = 0;
  (this->kmer_to_graphposition)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->kmer_to_graphposition)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->kmer_to_graphposition)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  this->k = _k;
  local_370 = &this->unique_kmers_per_node;
  (this->unique_kmers_per_node).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->unique_kmers_per_node).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->unique_kmers_per_node).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->total_kmers_per_node).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->total_kmers_per_node).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->total_kmers_per_node).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  _Hashtable<unsigned___int128,_std::pair<const_unsigned___int128,_graphStrandPos>,_std::allocator<std::pair<const_unsigned___int128,_graphStrandPos>_>,_std::__detail::_Select1st,_std::equal_to<unsigned___int128>,_int128_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::clear((_Hashtable<unsigned___int128,_std::pair<const_unsigned___int128,_graphStrandPos>,_std::allocator<std::pair<const_unsigned___int128,_graphStrandPos>_>,_std::__detail::_Select1st,_std::equal_to<unsigned___int128>,_int128_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
           *)this);
  local_3a8.
  super__Vector_base<std::pair<unsigned___int128,_graphStrandPos>,_std::allocator<std::pair<unsigned___int128,_graphStrandPos>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_3a8.
  super__Vector_base<std::pair<unsigned___int128,_graphStrandPos>,_std::allocator<std::pair<unsigned___int128,_graphStrandPos>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_3a8.
  super__Vector_base<std::pair<unsigned___int128,_graphStrandPos>,_std::allocator<std::pair<unsigned___int128,_graphStrandPos>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_360 = 0;
  local_3b0 = this;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_2d8,
             ((long)(sg->nodes).super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(sg->nodes).super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
                    super__Vector_impl_data._M_start >> 3) * 0x6db6db6db6db6db7,&local_360,
             (allocator_type *)&local_318);
  puVar12 = (this->total_kmers_per_node).
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start;
  puVar2 = (this->total_kmers_per_node).
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  (this->total_kmers_per_node).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)local_2d8._0_8_;
  (this->total_kmers_per_node).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)local_2d8._8_8_;
  (this->total_kmers_per_node).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = local_2c8;
  local_2d8._0_8_ = (pointer *)0x0;
  local_2d8._8_8_ = (pointer)0x0;
  local_2c8 = (pointer)0x0;
  if ((puVar12 != (pointer)0x0) &&
     (operator_delete(puVar12,(long)puVar2 - (long)puVar12),
     (pointer *)local_2d8._0_8_ != (pointer *)0x0)) {
    operator_delete((void *)local_2d8._0_8_,(long)local_2c8 - local_2d8._0_8_);
  }
  pNVar16 = (sg->nodes).super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((sg->nodes).super__Vector_base<Node,_std::allocator<Node>_>._M_impl.super__Vector_impl_data.
      _M_finish == pNVar16) {
    __n = 0;
  }
  else {
    lVar18 = 0;
    __n = 0;
    uVar22 = 0;
    do {
      lVar17 = *(long *)((long)&(pNVar16->sequence)._M_dataplus._M_p + lVar18);
      local_2d8._0_8_ = &local_2c8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_2d8,lVar17,
                 *(long *)((long)&(pNVar16->sequence)._M_string_length + lVar18) + lVar17);
      local_2a8 = *(undefined8 *)((long)&(pNVar16->support).id + lVar18);
      local_2b8 = *(undefined8 *)(&pNVar16->status + lVar18);
      pSVar7 = (Support *)(&pNVar16->status + lVar18 + 8);
      uStack_2b0._0_1_ = pSVar7->type;
      uStack_2b0._1_1_ = pSVar7->field_0x1;
      uStack_2b0._2_2_ = pSVar7->index;
      uStack_2b0._4_4_ = *(undefined4 *)&pSVar7->field_0x4;
      puVar12 = (pointer)(ulong)local_3b0->k;
      if (puVar12 <= (ulong)local_2d8._8_8_) {
        __n = local_2d8._8_8_ + (__n - (long)puVar12) + 1;
        (local_3b0->total_kmers_per_node).
        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start[uVar22] = local_2d8._8_8_ + (1 - (long)puVar12);
      }
      if ((pointer *)local_2d8._0_8_ != &local_2c8) {
        operator_delete((void *)local_2d8._0_8_,(long)local_2c8 + 1);
      }
      uVar22 = uVar22 + 1;
      pNVar16 = (sg->nodes).super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
                super__Vector_impl_data._M_start;
      lVar18 = lVar18 + 0x38;
    } while (uVar22 < (ulong)(((long)(sg->nodes).super__Vector_base<Node,_std::allocator<Node>_>.
                                     _M_impl.super__Vector_impl_data._M_finish - (long)pNVar16 >> 3)
                             * 0x6db6db6db6db6db7));
  }
  std::
  vector<std::pair<unsigned___int128,_graphStrandPos>,_std::allocator<std::pair<unsigned___int128,_graphStrandPos>_>_>
  ::reserve(&local_3a8,__n);
  this_00 = local_3b0;
  local_358 = &local_348;
  local_350 = 0;
  local_348 = 0;
  local_338 = &local_328;
  local_330 = 0;
  local_328 = 0;
  local_2d8[0] = local_3b0->k;
  uVar6 = (uint)local_3b0->k * 2;
  uVar22 = -1L << ((byte)uVar6 & 0x3f);
  local_2a8 = uVar22;
  local_2a0 = 0xffffffffffffffff;
  if ((uVar6 & 0x40) != 0) {
    local_2a8 = 0;
    local_2a0 = uVar22;
  }
  local_2a8 = ~local_2a8;
  local_2a0 = ~local_2a0;
  local_2d8._8_8_ = (pointer)0x0;
  local_2c8 = (pointer)0x0;
  uStack_2c0 = 0;
  local_2b8 = 0;
  uStack_2b0 = 0;
  local_298 = (ulong)uVar6 - 2;
  local_290 = (ulong)(1 < (ulong)uVar6) - 1;
  local_198[0] = '\0';
  local_198[1] = '\0';
  local_198[2] = '\0';
  local_198[3] = '\0';
  local_198[4] = '\0';
  local_198[5] = '\0';
  local_198[6] = '\0';
  local_198[7] = '\0';
  local_198[8] = '\0';
  local_198[9] = '\0';
  local_198[10] = '\0';
  local_198[0xb] = '\0';
  local_198[0xc] = '\0';
  local_198[0xd] = '\0';
  local_198[0xe] = '\0';
  local_198[0xf] = '\0';
  local_98[0] = '\0';
  local_98[1] = '\0';
  local_98[2] = '\0';
  local_98[3] = '\0';
  local_98[4] = '\0';
  local_98[5] = '\0';
  local_98[6] = '\0';
  local_98[7] = '\0';
  local_98[8] = '\0';
  local_98[9] = '\0';
  local_98[10] = '\0';
  local_98[0xb] = '\0';
  local_98[0xc] = '\0';
  local_98[0xd] = '\0';
  local_98[0xe] = '\0';
  local_98[0xf] = '\0';
  memset(local_288,4,0xff);
  memset(local_198 + 0x10,4,0xff);
  local_247 = '\0';
  local_227 = '\0';
  local_245 = '\x01';
  local_225 = '\x01';
  local_241 = '\x02';
  local_221 = '\x02';
  local_234 = '\x03';
  local_214 = '\x03';
  local_147 = '\x03';
  local_127 = '\x03';
  local_145 = '\x02';
  local_125 = '\x02';
  local_141 = '\x01';
  local_121 = '\x01';
  local_134 = '\0';
  local_114 = '\0';
  local_80._M_p = (pointer)&local_70;
  local_78 = 0;
  local_70._M_local_buf[0] = '\0';
  local_60._M_p = (pointer)local_50;
  local_58 = 0;
  local_50[0]._M_local_buf[0] = '\0';
  pNVar16 = (sg->nodes).super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
            super__Vector_impl_data._M_start;
  pNVar10 = (sg->nodes).super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (1 < (ulong)(((long)pNVar10 - (long)pNVar16 >> 3) * 0x6db6db6db6db6db7)) {
    uVar22 = 1;
    lVar18 = 0x38;
    do {
      if ((ulong)this_00->k <= *(ulong *)((long)&(pNVar16->sequence)._M_string_length + lVar18)) {
        local_360 = CONCAT44(local_360._4_4_,(int)uVar22);
        std::__cxx11::string::_M_assign((string *)&local_338);
        local_88 = (int32_t)local_360;
        std::__cxx11::string::_M_assign((string *)&local_80);
        std::__cxx11::string::_M_assign((string *)&local_60);
        uStack_2c0 = 0;
        local_2b8 = 0;
        local_2d8._8_8_ = (pointer)0x0;
        local_2c8 = (pointer)0x0;
        uStack_2b0 = 0;
        kmerPosFactory128::next_element((kmerPosFactory128 *)local_2d8,&local_3a8);
        pNVar16 = (sg->nodes).super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
                  super__Vector_impl_data._M_start;
        pNVar10 = (sg->nodes).super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      }
      uVar22 = uVar22 + 1;
      lVar18 = lVar18 + 0x38;
    } while (uVar22 < (ulong)(((long)pNVar10 - (long)pNVar16 >> 3) * 0x6db6db6db6db6db7));
  }
  ppVar8 = local_3a8.
           super__Vector_base<std::pair<unsigned___int128,_graphStrandPos>,_std::allocator<std::pair<unsigned___int128,_graphStrandPos>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  ppVar14 = local_3a8.
            super__Vector_base<std::pair<unsigned___int128,_graphStrandPos>,_std::allocator<std::pair<unsigned___int128,_graphStrandPos>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppVar15 = local_3a8.
            super__Vector_base<std::pair<unsigned___int128,_graphStrandPos>,_std::allocator<std::pair<unsigned___int128,_graphStrandPos>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppVar20 = local_3a8.
            super__Vector_base<std::pair<unsigned___int128,_graphStrandPos>,_std::allocator<std::pair<unsigned___int128,_graphStrandPos>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (local_3a8.
      super__Vector_base<std::pair<unsigned___int128,_graphStrandPos>,_std::allocator<std::pair<unsigned___int128,_graphStrandPos>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_3a8.
      super__Vector_base<std::pair<unsigned___int128,_graphStrandPos>,_std::allocator<std::pair<unsigned___int128,_graphStrandPos>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    lVar17 = (long)local_3a8.
                   super__Vector_base<std::pair<unsigned___int128,_graphStrandPos>,_std::allocator<std::pair<unsigned___int128,_graphStrandPos>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)local_3a8.
                   super__Vector_base<std::pair<unsigned___int128,_graphStrandPos>,_std::allocator<std::pair<unsigned___int128,_graphStrandPos>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
    uVar22 = lVar17 >> 5;
    lVar18 = 0x3f;
    if (uVar22 != 0) {
      for (; uVar22 >> lVar18 == 0; lVar18 = lVar18 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<std::pair<unsigned__int128,graphStrandPos>*,std::vector<std::pair<unsigned__int128,graphStrandPos>,std::allocator<std::pair<unsigned__int128,graphStrandPos>>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<Unique63merIndex::Unique63merIndex(SequenceDistanceGraph_const&,unsigned_char)::__0>>
              (local_3a8.
               super__Vector_base<std::pair<unsigned___int128,_graphStrandPos>,_std::allocator<std::pair<unsigned___int128,_graphStrandPos>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
               local_3a8.
               super__Vector_base<std::pair<unsigned___int128,_graphStrandPos>,_std::allocator<std::pair<unsigned___int128,_graphStrandPos>_>_>
               ._M_impl.super__Vector_impl_data._M_finish,((uint)lVar18 ^ 0x3f) * 2 ^ 0x7e);
    if (lVar17 < 0x201) {
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<std::pair<unsigned__int128,graphStrandPos>*,std::vector<std::pair<unsigned__int128,graphStrandPos>,std::allocator<std::pair<unsigned__int128,graphStrandPos>>>>,__gnu_cxx::__ops::_Iter_comp_iter<Unique63merIndex::Unique63merIndex(SequenceDistanceGraph_const&,unsigned_char)::__0>>
                (ppVar14,ppVar8);
      ppVar15 = local_3a8.
                super__Vector_base<std::pair<unsigned___int128,_graphStrandPos>,_std::allocator<std::pair<unsigned___int128,_graphStrandPos>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      ppVar20 = local_3a8.
                super__Vector_base<std::pair<unsigned___int128,_graphStrandPos>,_std::allocator<std::pair<unsigned___int128,_graphStrandPos>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      this_00 = local_3b0;
    }
    else {
      ppVar24 = ppVar14 + 0x10;
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<std::pair<unsigned__int128,graphStrandPos>*,std::vector<std::pair<unsigned__int128,graphStrandPos>,std::allocator<std::pair<unsigned__int128,graphStrandPos>>>>,__gnu_cxx::__ops::_Iter_comp_iter<Unique63merIndex::Unique63merIndex(SequenceDistanceGraph_const&,unsigned_char)::__0>>
                (ppVar14,ppVar24);
      ppVar15 = local_3a8.
                super__Vector_base<std::pair<unsigned___int128,_graphStrandPos>,_std::allocator<std::pair<unsigned___int128,_graphStrandPos>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      ppVar20 = local_3a8.
                super__Vector_base<std::pair<unsigned___int128,_graphStrandPos>,_std::allocator<std::pair<unsigned___int128,_graphStrandPos>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      this_00 = local_3b0;
      if (ppVar24 != ppVar8) {
        pgVar23 = &ppVar14[0x10].second;
        do {
          uVar22 = (ulong)ppVar24->first;
          uVar3 = *(ulong *)((long)&ppVar24->first + 8);
          uVar1 = (ppVar24->second).pos;
          local_318._M_bucket_count = CONCAT44(local_318._M_bucket_count._4_4_,uVar1);
          local_318._M_buckets = (__buckets_ptr)(ppVar24->second).node;
          uVar19 = *(ulong *)((long)&ppVar24[-1].first + 8);
          uVar21 = (ulong)ppVar24[-1].first;
          ppVar14 = ppVar24;
          pgVar9 = pgVar23;
          if (uVar3 < uVar19 || uVar3 - uVar19 < (ulong)(uVar22 < uVar21)) {
            do {
              pgVar13 = pgVar9;
              *(ulong *)&((pair<unsigned___int128,_graphStrandPos> *)(pgVar13 + -1))->first = uVar21
              ;
              *(ulong *)((long)&((pair<unsigned___int128,_graphStrandPos> *)(pgVar13 + -1))->first +
                        8) = uVar19;
              pgVar13->node = pgVar13[-2].node;
              pgVar13->pos = *(uint32_t *)((long)(pgVar13 + -2) + 8);
              uVar21 = *(ulong *)(pgVar13 + -5);
              uVar19 = *(ulong *)((long)(pgVar13 + -5) + 8);
              pgVar9 = pgVar13 + -2;
            } while (uVar3 < uVar19 || uVar3 - uVar19 < (ulong)(uVar22 < uVar21));
            ppVar14 = (pointer)(pgVar13 + -3);
          }
          *(ulong *)&ppVar14->first = uVar22;
          *(ulong *)((long)&ppVar14->first + 8) = uVar3;
          (ppVar14->second).node = (sgNodeID_t)local_318._M_buckets;
          (ppVar14->second).pos = uVar1;
          ppVar24 = ppVar24 + 1;
          pgVar23 = pgVar23 + 2;
        } while (ppVar24 != ppVar8);
      }
    }
  }
  do {
    ppVar14 = ppVar15;
    if (local_3a8.
        super__Vector_base<std::pair<unsigned___int128,_graphStrandPos>,_std::allocator<std::pair<unsigned___int128,_graphStrandPos>_>_>
        ._M_impl.super__Vector_impl_data._M_finish <= ppVar14) {
      std::
      vector<std::pair<unsigned___int128,_graphStrandPos>,_std::allocator<std::pair<unsigned___int128,_graphStrandPos>_>_>
      ::resize(&local_3a8,
               (long)ppVar20 -
               (long)local_3a8.
                     super__Vector_base<std::pair<unsigned___int128,_graphStrandPos>,_std::allocator<std::pair<unsigned___int128,_graphStrandPos>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 5);
      local_318._M_buckets = &local_318._M_single_bucket;
      local_318._M_bucket_count = 1;
      local_318._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      local_318._M_element_count = 0;
      local_318._M_rehash_policy._M_max_load_factor = 1.0;
      local_318._M_rehash_policy._M_next_resize = 0;
      local_318._M_single_bucket = (__node_base_ptr)0x0;
      lVar18 = ((long)(sg->nodes).super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)(sg->nodes).super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
                      super__Vector_impl_data._M_start >> 3) * 0x6db6db6db6db6db7;
      auVar25._8_4_ = (int)((ulong)lVar18 >> 0x20);
      auVar25._0_8_ = lVar18;
      auVar25._12_4_ = 0x45300000;
      dVar26 = (auVar25._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)lVar18) - 4503599627370496.0);
      uVar22 = (ulong)dVar26;
      std::
      _Hashtable<long,_long,_std::allocator<long>,_std::__detail::_Identity,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::rehash(&local_318,(long)(dVar26 - 9.223372036854776e+18) & (long)uVar22 >> 0x3f | uVar22);
      local_368 = 0;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                (&local_388,
                 ((long)(sg->nodes).super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)(sg->nodes).super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
                        super__Vector_impl_data._M_start >> 3) * 0x6db6db6db6db6db7,&local_368,
                 &local_3b1);
      puVar12 = *(pointer *)
                 &((vector<unsigned_long,_std::allocator<unsigned_long>_> *)((long)this_00 + 0x40))
                  ->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>;
      puVar2 = *(pointer *)
                &((vector<unsigned_long,_std::allocator<unsigned_long>_> *)((long)this_00 + 0x50))->
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>;
      *(pointer *)
       &((vector<unsigned_long,_std::allocator<unsigned_long>_> *)((long)this_00 + 0x40))->
        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_> =
           local_388.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
      *(pointer *)
       &((vector<unsigned_long,_std::allocator<unsigned_long>_> *)((long)this_00 + 0x48))->
        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_> =
           local_388.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish;
      *(pointer *)
       &((vector<unsigned_long,_std::allocator<unsigned_long>_> *)((long)this_00 + 0x50))->
        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_> =
           local_388.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
      local_388.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_388.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_388.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      if ((puVar12 != (pointer)0x0) &&
         (operator_delete(puVar12,(long)puVar2 - (long)puVar12),
         (_Hashtable<long,_long,_std::allocator<long>,_std::__detail::_Identity,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          *)local_388.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start !=
         (_Hashtable<long,_long,_std::allocator<long>,_std::__detail::_Identity,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          *)0x0)) {
        operator_delete(local_388.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_388.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_388.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      lVar18 = (long)local_3a8.
                     super__Vector_base<std::pair<unsigned___int128,_graphStrandPos>,_std::allocator<std::pair<unsigned___int128,_graphStrandPos>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)local_3a8.
                     super__Vector_base<std::pair<unsigned___int128,_graphStrandPos>,_std::allocator<std::pair<unsigned___int128,_graphStrandPos>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 5;
      auVar27._8_4_ =
           (int)((long)local_3a8.
                       super__Vector_base<std::pair<unsigned___int128,_graphStrandPos>,_std::allocator<std::pair<unsigned___int128,_graphStrandPos>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_3a8.
                       super__Vector_base<std::pair<unsigned___int128,_graphStrandPos>,_std::allocator<std::pair<unsigned___int128,_graphStrandPos>_>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 0x25);
      auVar27._0_8_ = lVar18;
      auVar27._12_4_ = 0x45300000;
      dVar26 = ceil(((auVar27._8_8_ - 1.9342813113834067e+25) +
                    ((double)CONCAT44(0x43300000,(int)lVar18) - 4503599627370496.0)) /
                    (double)*(float *)&((Map *)((long)this_00 + 0x20))->_M_h);
      std::
      _Hashtable<unsigned___int128,_std::pair<const_unsigned___int128,_graphStrandPos>,_std::allocator<std::pair<const_unsigned___int128,_graphStrandPos>_>,_std::__detail::_Select1st,_std::equal_to<unsigned___int128>,_int128_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::rehash((_Hashtable<unsigned___int128,_std::pair<const_unsigned___int128,_graphStrandPos>,_std::allocator<std::pair<const_unsigned___int128,_graphStrandPos>_>,_std::__detail::_Select1st,_std::equal_to<unsigned___int128>,_int128_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                *)this_00,
               (long)(dVar26 - 9.223372036854776e+18) & (long)dVar26 >> 0x3f | (long)dVar26);
      ppVar20 = local_3a8.
                super__Vector_base<std::pair<unsigned___int128,_graphStrandPos>,_std::allocator<std::pair<unsigned___int128,_graphStrandPos>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      if (local_3a8.
          super__Vector_base<std::pair<unsigned___int128,_graphStrandPos>,_std::allocator<std::pair<unsigned___int128,_graphStrandPos>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          local_3a8.
          super__Vector_base<std::pair<unsigned___int128,_graphStrandPos>,_std::allocator<std::pair<unsigned___int128,_graphStrandPos>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        ppVar14 = local_3a8.
                  super__Vector_base<std::pair<unsigned___int128,_graphStrandPos>,_std::allocator<std::pair<unsigned___int128,_graphStrandPos>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        do {
          sVar4 = (ppVar14->second).node;
          uVar1 = (ppVar14->second).pos;
          pmVar11 = std::__detail::
                    _Map_base<unsigned___int128,_std::pair<const_unsigned___int128,_graphStrandPos>,_std::allocator<std::pair<const_unsigned___int128,_graphStrandPos>_>,_std::__detail::_Select1st,_std::equal_to<unsigned___int128>,_int128_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                    ::operator[]((_Map_base<unsigned___int128,_std::pair<const_unsigned___int128,_graphStrandPos>,_std::allocator<std::pair<const_unsigned___int128,_graphStrandPos>_>,_std::__detail::_Select1st,_std::equal_to<unsigned___int128>,_int128_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                  *)local_3b0,&ppVar14->first);
          pmVar11->node = sVar4;
          pmVar11->pos = uVar1;
          lVar18 = (ppVar14->second).node;
          lVar17 = -lVar18;
          if (0 < lVar18) {
            lVar17 = lVar18;
          }
          puVar12 = (local_370->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                    _M_impl.super__Vector_impl_data._M_start + lVar17;
          *puVar12 = *puVar12 + 1;
          vVar5 = (ppVar14->second).node;
          local_368 = -vVar5;
          if (0 < (long)vVar5) {
            local_368 = vVar5;
          }
          local_388.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)&local_318;
          std::
          _Hashtable<long,long,std::allocator<long>,std::__detail::_Identity,std::equal_to<long>,std::hash<long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
          ::
          _M_insert<long,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<long,false>>>>
                    ((_Hashtable<long,long,std::allocator<long>,std::__detail::_Identity,std::equal_to<long>,std::hash<long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                      *)local_388.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_start,&local_368,&local_388);
          ppVar14 = ppVar14 + 1;
        } while (ppVar14 != ppVar20);
      }
      std::
      _Hashtable<long,_long,_std::allocator<long>,_std::__detail::_Identity,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::~_Hashtable(&local_318);
      kmerPosFactory128::~kmerPosFactory128((kmerPosFactory128 *)local_2d8);
      if (local_338 != &local_328) {
        operator_delete(local_338,CONCAT71(uStack_327,local_328) + 1);
      }
      if (local_358 != &local_348) {
        operator_delete(local_358,CONCAT71(uStack_347,local_348) + 1);
      }
      if (local_3a8.
          super__Vector_base<std::pair<unsigned___int128,_graphStrandPos>,_std::allocator<std::pair<unsigned___int128,_graphStrandPos>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_3a8.
                        super__Vector_base<std::pair<unsigned___int128,_graphStrandPos>,_std::allocator<std::pair<unsigned___int128,_graphStrandPos>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_3a8.
                              super__Vector_base<std::pair<unsigned___int128,_graphStrandPos>,_std::allocator<std::pair<unsigned___int128,_graphStrandPos>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_3a8.
                              super__Vector_base<std::pair<unsigned___int128,_graphStrandPos>,_std::allocator<std::pair<unsigned___int128,_graphStrandPos>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      return;
    }
    lVar18 = (long)ppVar14->first;
    lVar17 = *(long *)((long)&ppVar14->first + 8);
    ppVar15 = ppVar14;
    do {
      if (*(long *)((long)&ppVar15->first + 8) != lVar17 || (long)ppVar15->first != lVar18) break;
      ppVar15 = ppVar15 + 1;
    } while (ppVar15 !=
             local_3a8.
             super__Vector_base<std::pair<unsigned___int128,_graphStrandPos>,_std::allocator<std::pair<unsigned___int128,_graphStrandPos>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
    if ((long)ppVar15 - (long)ppVar14 == 0x20) {
      *(long *)&ppVar20->first = lVar18;
      *(long *)((long)&ppVar20->first + 8) = lVar17;
      (ppVar20->second).node = (ppVar14->second).node;
      (ppVar20->second).pos = (ppVar14->second).pos;
      ppVar20 = ppVar20 + 1;
    }
  } while( true );
}

Assistant:

Unique63merIndex::Unique63merIndex(const SequenceDistanceGraph &sg, const uint8_t _k) : k(_k){
    kmer_to_graphposition.clear();
    std::vector<pair> kidxv;
    uint64_t total_k { 0 };
    total_kmers_per_node = std::vector<uint64_t>(sg.nodes.size(), 0);
    for (sgNodeID_t node = 0; node < sg.nodes.size(); node++) {
        auto sgnode = sg.nodes[node];
        if (sgnode.sequence.size() >= k) {
            auto n = sgnode.sequence.size() + 1 - k;
            total_k += n;
            total_kmers_per_node[node] = n;
        }
    }
    kidxv.reserve(total_k);
    FastaRecord r;
    kmerPosFactory128 kcf({k});
    for (sgNodeID_t n = 1; n < sg.nodes.size(); ++n) {
        if (sg.nodes[n].sequence.size() >= k) {
            r.id = n;
            r.seq = sg.nodes[n].sequence;
            kcf.setFileRecord(r);
            kcf.next_element(kidxv);
        }
    }

    sdglib::sort(kidxv.begin(),kidxv.end(),[](const pair & a, const pair & b){return a.first<b.first;});

    auto wi=kidxv.begin();
    auto ri=kidxv.begin();
    auto nri=kidxv.begin();
    while (ri<kidxv.end()){
        while (nri!=kidxv.end() and nri->first==ri->first) ++nri;
        if (nri-ri==1) {
            *wi=*ri;
            ++wi;
        }
        ri=nri;
    }
    kidxv.resize(wi - kidxv.begin());

    std::unordered_set<sgNodeID_t > seen_contigs;
    seen_contigs.reserve(sg.nodes.size());
    unique_kmers_per_node = std::vector<uint64_t>(sg.nodes.size(), 0);
    kmer_to_graphposition.reserve(kidxv.size());
    for (auto &kidx :kidxv) {
        kmer_to_graphposition[kidx.first] = { kidx.second.node, kidx.second.pos };
        unique_kmers_per_node[std::abs(kidx.second.node)] += 1;
        seen_contigs.insert(std::abs(kidx.second.node));
    }
}